

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmime_string.c
# Opt level: O0

char * cmime_string_chomp(char *s)

{
  char cVar1;
  size_t sVar2;
  char *pcVar3;
  char *p;
  char *s_local;
  
  sVar2 = strlen(s);
  cVar1 = s[sVar2 - 1];
  if (cVar1 == '\n') {
    pcVar3 = strrchr(s,0xd);
    if (pcVar3 == (char *)0x0) {
      pcVar3 = strrchr(s,10);
      *pcVar3 = '\0';
    }
    else {
      *pcVar3 = '\0';
    }
  }
  else if (cVar1 == '\f') {
    pcVar3 = strrchr(s,0xc);
    *pcVar3 = '\0';
  }
  else if (cVar1 == '\r') {
    pcVar3 = strrchr(s,0xd);
    *pcVar3 = '\0';
  }
  return s;
}

Assistant:

char *cmime_string_chomp(char *s) {
    char *p = NULL;
    
    switch(s[strlen(s)-1]) {
        case '\n':
            if((p = strrchr(s,'\r')) != NULL ) *p = '\0';
            else *(p = strrchr(s,'\n')) = '\0';
            break;
        case '\r':
            *(p = strrchr(s,'\r')) = '\0';
            break;
        case '\x0c':
            *(p = strrchr(s,'\x0c')) = '\0';
            break;
    }

    return(s);
}